

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O3

void __thiscall Fluid_Table::Fluid_Table(Fluid_Table *this,int x,int y,int w,int h,char *l)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *piVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  long lVar9;
  
  Fl_Table::Fl_Table(&this->super_Fl_Table,x,y,w,h,l);
  (this->super_Fl_Table).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Table_00271d18;
  auVar2 = _DAT_00210030;
  auVar1 = _DAT_00210020;
  piVar3 = this->data[0] + 1;
  iVar4 = 0x3e9;
  lVar5 = 0;
  do {
    lVar7 = 0;
    auVar8 = auVar1;
    iVar6 = iVar4;
    do {
      if (SUB164(auVar8 ^ auVar2,4) == -0x80000000 && SUB164(auVar8 ^ auVar2,0) < -0x7ffffff9) {
        piVar3[lVar7 + -1] = iVar6 + -1;
        piVar3[lVar7] = iVar6;
      }
      lVar7 = lVar7 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      iVar6 = iVar6 + 2;
    } while (lVar7 != 8);
    lVar5 = lVar5 + 1;
    iVar4 = iVar4 + 1000;
    piVar3 = piVar3 + 7;
  } while (lVar5 != 0xe);
  Fl_Table::rows(&this->super_Fl_Table,0xe);
  (this->super_Fl_Table)._row_header = '\x01';
  Fl_Table::table_resized(&this->super_Fl_Table);
  Fl_Widget::redraw((Fl_Widget *)this);
  if (0 < (this->super_Fl_Table)._rows) {
    iVar4 = 0;
    do {
      Fl_Table::row_height(&this->super_Fl_Table,iVar4,0x14);
      iVar4 = iVar4 + 1;
    } while (iVar4 < (this->super_Fl_Table)._rows);
  }
  (this->super_Fl_Table)._row_resize = '\0';
  (*(this->super_Fl_Table).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xd])(this,7);
  (this->super_Fl_Table)._col_header = '\x01';
  Fl_Table::table_resized(&this->super_Fl_Table);
  Fl_Widget::redraw((Fl_Widget *)this);
  if (0 < (this->super_Fl_Table)._cols) {
    iVar4 = 0;
    do {
      Fl_Table::col_width(&this->super_Fl_Table,iVar4,0x50);
      iVar4 = iVar4 + 1;
    } while (iVar4 < (this->super_Fl_Table)._cols);
  }
  (this->super_Fl_Table)._col_resize = '\x01';
  return;
}

Assistant:

Fluid_Table(int x, int y, int w, int h, const char *l=0L)
  : Fl_Table(x, y, w, h, l) {
    for ( int r=0; r<MAX_ROWS; r++ )
      for ( int c=0; c<MAX_COLS; c++ )
        data[r][c] = 1000+(r*1000)+c;
    // Rows
    rows(MAX_ROWS);             // how many rows
    row_header(1);              // enable row headers (along left)
    row_height_all(20);         // default height of rows
    row_resize(0);              // disable row resizing                                // Cols
    cols(MAX_COLS);             // how many columns
    col_header(1);              // enable column headers (along top)
    col_width_all(80);          // default width of columns
    col_resize(1);              // enable column resizing
  }